

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O2

void helper_msa_bset_b_mips64(CPUMIPSState_conflict5 *env,uint32_t wd,uint32_t ws,uint32_t wt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  char cVar3;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  undefined1 auVar4 [16];
  char cVar19;
  undefined1 auVar20 [16];
  
  auVar4 = psllw((undefined1  [16])(env->active_fpu).fpr[wt],5);
  auVar4 = auVar4 & _DAT_00b902b0;
  cVar3 = auVar4[0];
  cVar5 = auVar4[1];
  cVar6 = auVar4[2];
  cVar7 = auVar4[3];
  cVar8 = auVar4[4];
  cVar9 = auVar4[5];
  cVar10 = auVar4[6];
  cVar11 = auVar4[7];
  cVar12 = auVar4[8];
  cVar13 = auVar4[9];
  cVar14 = auVar4[10];
  cVar15 = auVar4[0xb];
  cVar16 = auVar4[0xc];
  cVar17 = auVar4[0xd];
  cVar18 = auVar4[0xe];
  cVar19 = auVar4[0xf];
  auVar4[0] = (-(cVar3 < '\0') & 0x10U) + -(cVar3 < '\0') + '\x01';
  auVar4[1] = (-(cVar5 < '\0') & 0x10U) + -(cVar5 < '\0') + '\x01';
  auVar4[2] = (-(cVar6 < '\0') & 0x10U) + -(cVar6 < '\0') + '\x01';
  auVar4[3] = (-(cVar7 < '\0') & 0x10U) + -(cVar7 < '\0') + '\x01';
  auVar4[4] = (-(cVar8 < '\0') & 0x10U) + -(cVar8 < '\0') + '\x01';
  auVar4[5] = (-(cVar9 < '\0') & 0x10U) + -(cVar9 < '\0') + '\x01';
  auVar4[6] = (-(cVar10 < '\0') & 0x10U) + -(cVar10 < '\0') + '\x01';
  auVar4[7] = (-(cVar11 < '\0') & 0x10U) + -(cVar11 < '\0') + '\x01';
  auVar4[8] = (-(cVar12 < '\0') & 0x10U) + -(cVar12 < '\0') + '\x01';
  auVar4[9] = (-(cVar13 < '\0') & 0x10U) + -(cVar13 < '\0') + '\x01';
  auVar4[10] = (-(cVar14 < '\0') & 0x10U) + -(cVar14 < '\0') + '\x01';
  auVar4[0xb] = (-(cVar15 < '\0') & 0x10U) + -(cVar15 < '\0') + '\x01';
  auVar4[0xc] = (-(cVar16 < '\0') & 0x10U) + -(cVar16 < '\0') + '\x01';
  auVar4[0xd] = (-(cVar17 < '\0') & 0x10U) + -(cVar17 < '\0') + '\x01';
  auVar4[0xe] = (-(cVar18 < '\0') & 0x10U) + -(cVar18 < '\0') + '\x01';
  auVar4[0xf] = (-(cVar19 < '\0') & 0x10U) + -(cVar19 < '\0') + '\x01';
  auVar20[0] = -((char)(cVar3 * '\x02') < '\0');
  auVar20[1] = -((char)(cVar5 * '\x02') < '\0');
  auVar20[2] = -((char)(cVar6 * '\x02') < '\0');
  auVar20[3] = -((char)(cVar7 * '\x02') < '\0');
  auVar20[4] = -((char)(cVar8 * '\x02') < '\0');
  auVar20[5] = -((char)(cVar9 * '\x02') < '\0');
  auVar20[6] = -((char)(cVar10 * '\x02') < '\0');
  auVar20[7] = -((char)(cVar11 * '\x02') < '\0');
  auVar20[8] = -((char)(cVar12 * '\x02') < '\0');
  auVar20[9] = -((char)(cVar13 * '\x02') < '\0');
  auVar20[10] = -((char)(cVar14 * '\x02') < '\0');
  auVar20[0xb] = -((char)(cVar15 * '\x02') < '\0');
  auVar20[0xc] = -((char)(cVar16 * '\x02') < '\0');
  auVar20[0xd] = -((char)(cVar17 * '\x02') < '\0');
  auVar20[0xe] = -((char)(cVar18 * '\x02') < '\0');
  auVar20[0xf] = -((char)(cVar19 * '\x02') < '\0');
  auVar1 = psllw(auVar4,2);
  auVar4 = auVar1 & auVar20 & _DAT_00b902d0 | ~auVar20 & auVar4;
  auVar2[0] = -((char)(cVar3 << 2) < '\0');
  auVar2[1] = -((char)(cVar5 << 2) < '\0');
  auVar2[2] = -((char)(cVar6 << 2) < '\0');
  auVar2[3] = -((char)(cVar7 << 2) < '\0');
  auVar2[4] = -((char)(cVar8 << 2) < '\0');
  auVar2[5] = -((char)(cVar9 << 2) < '\0');
  auVar2[6] = -((char)(cVar10 << 2) < '\0');
  auVar2[7] = -((char)(cVar11 << 2) < '\0');
  auVar2[8] = -((char)(cVar12 << 2) < '\0');
  auVar2[9] = -((char)(cVar13 << 2) < '\0');
  auVar2[10] = -((char)(cVar14 << 2) < '\0');
  auVar2[0xb] = -((char)(cVar15 << 2) < '\0');
  auVar2[0xc] = -((char)(cVar16 << 2) < '\0');
  auVar2[0xd] = -((char)(cVar17 << 2) < '\0');
  auVar2[0xe] = -((char)(cVar18 << 2) < '\0');
  auVar2[0xf] = -((char)(cVar19 << 2) < '\0');
  auVar1[1] = auVar4[1] * '\x02';
  auVar1[0] = auVar4[0] * '\x02';
  auVar1[2] = auVar4[2] * '\x02';
  auVar1[3] = auVar4[3] * '\x02';
  auVar1[4] = auVar4[4] * '\x02';
  auVar1[5] = auVar4[5] * '\x02';
  auVar1[6] = auVar4[6] * '\x02';
  auVar1[7] = auVar4[7] * '\x02';
  auVar1[8] = auVar4[8] * '\x02';
  auVar1[9] = auVar4[9] * '\x02';
  auVar1[10] = auVar4[10] * '\x02';
  auVar1[0xb] = auVar4[0xb] * '\x02';
  auVar1[0xc] = auVar4[0xc] * '\x02';
  auVar1[0xd] = auVar4[0xd] * '\x02';
  auVar1[0xe] = auVar4[0xe] * '\x02';
  auVar1[0xf] = auVar4[0xf] * '\x02';
  (env->active_fpu).fpr[wd] =
       (fpr_t)(auVar1 & auVar2 | ~auVar2 & auVar4 | (undefined1  [16])(env->active_fpu).fpr[ws]);
  return;
}

Assistant:

void helper_msa_bset_b(CPUMIPSState *env, uint32_t wd, uint32_t ws, uint32_t wt)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);

    pwd->b[0]  = msa_bset_df(DF_BYTE, pws->b[0],  pwt->b[0]);
    pwd->b[1]  = msa_bset_df(DF_BYTE, pws->b[1],  pwt->b[1]);
    pwd->b[2]  = msa_bset_df(DF_BYTE, pws->b[2],  pwt->b[2]);
    pwd->b[3]  = msa_bset_df(DF_BYTE, pws->b[3],  pwt->b[3]);
    pwd->b[4]  = msa_bset_df(DF_BYTE, pws->b[4],  pwt->b[4]);
    pwd->b[5]  = msa_bset_df(DF_BYTE, pws->b[5],  pwt->b[5]);
    pwd->b[6]  = msa_bset_df(DF_BYTE, pws->b[6],  pwt->b[6]);
    pwd->b[7]  = msa_bset_df(DF_BYTE, pws->b[7],  pwt->b[7]);
    pwd->b[8]  = msa_bset_df(DF_BYTE, pws->b[8],  pwt->b[8]);
    pwd->b[9]  = msa_bset_df(DF_BYTE, pws->b[9],  pwt->b[9]);
    pwd->b[10] = msa_bset_df(DF_BYTE, pws->b[10], pwt->b[10]);
    pwd->b[11] = msa_bset_df(DF_BYTE, pws->b[11], pwt->b[11]);
    pwd->b[12] = msa_bset_df(DF_BYTE, pws->b[12], pwt->b[12]);
    pwd->b[13] = msa_bset_df(DF_BYTE, pws->b[13], pwt->b[13]);
    pwd->b[14] = msa_bset_df(DF_BYTE, pws->b[14], pwt->b[14]);
    pwd->b[15] = msa_bset_df(DF_BYTE, pws->b[15], pwt->b[15]);
}